

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_algebraic.hpp
# Opt level: O0

Opers chaiscript::Operators::to_operator(string *t_str,bool t_is_unary)

{
  byte bVar1;
  bool bVar2;
  byte in_SIL;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  undefined7 in_stack_ffffffffffffffe8;
  undefined4 local_4;
  
  bVar1 = in_SIL & 1;
  bVar2 = std::operator==(in_RDI,(char *)(CONCAT17(in_SIL,in_stack_ffffffffffffffe8) &
                                         0x1ffffffffffffff));
  if (bVar2) {
    local_4 = equals;
  }
  else {
    bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
    if (bVar2) {
      local_4 = less_than;
    }
    else {
      bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
      if (bVar2) {
        local_4 = greater_than;
      }
      else {
        bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
        if (bVar2) {
          local_4 = less_than_equal;
        }
        else {
          bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
          if (bVar2) {
            local_4 = greater_than_equal;
          }
          else {
            bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
            if (bVar2) {
              local_4 = not_equal;
            }
            else {
              bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
              if (bVar2) {
                local_4 = assign;
              }
              else {
                bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
                if (bVar2) {
                  local_4 = pre_increment;
                }
                else {
                  bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8));
                  if (bVar2) {
                    local_4 = pre_decrement;
                  }
                  else {
                    bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,in_stack_ffffffffffffffe8)
                                           );
                    if (bVar2) {
                      local_4 = assign_product;
                    }
                    else {
                      bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                      if (bVar2) {
                        local_4 = assign_sum;
                      }
                      else {
                        bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                        if (bVar2) {
                          local_4 = assign_difference;
                        }
                        else {
                          bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                          if (bVar2) {
                            local_4 = assign_bitwise_and;
                          }
                          else {
                            bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                            if (bVar2) {
                              local_4 = assign_bitwise_or;
                            }
                            else {
                              bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                              if (bVar2) {
                                local_4 = assign_shift_left;
                              }
                              else {
                                bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                                if (bVar2) {
                                  local_4 = assign_shift_right;
                                }
                                else {
                                  bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                                  if (bVar2) {
                                    local_4 = assign_remainder;
                                  }
                                  else {
                                    bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                                    if (bVar2) {
                                      local_4 = assign_bitwise_xor;
                                    }
                                    else {
                                      bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                                      if (bVar2) {
                                        local_4 = shift_left;
                                      }
                                      else {
                                        bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                                        if (bVar2) {
                                          local_4 = shift_right;
                                        }
                                        else {
                                          bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                                          if (bVar2) {
                                            local_4 = remainder;
                                          }
                                          else {
                                            bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                                            if (bVar2) {
                                              local_4 = bitwise_and;
                                            }
                                            else {
                                              bVar2 = std::operator==(in_RDI,(char *)CONCAT17(bVar1,
                                                  in_stack_ffffffffffffffe8));
                                              if (bVar2) {
                                                local_4 = bitwise_or;
                                              }
                                              else {
                                                bVar2 = std::operator==(in_RDI,(char *)CONCAT17(
                                                  bVar1,in_stack_ffffffffffffffe8));
                                                if (bVar2) {
                                                  local_4 = bitwise_xor;
                                                }
                                                else {
                                                  bVar2 = std::operator==(in_RDI,(char *)CONCAT17(
                                                  bVar1,in_stack_ffffffffffffffe8));
                                                  if (bVar2) {
                                                    local_4 = bitwise_complement;
                                                  }
                                                  else {
                                                    bVar2 = std::operator==(in_RDI,(char *)CONCAT17(
                                                  bVar1,in_stack_ffffffffffffffe8));
                                                  if (bVar2) {
                                                    if ((bVar1 & 1) == 0) {
                                                      local_4 = sum;
                                                    }
                                                    else {
                                                      local_4 = unary_plus;
                                                    }
                                                  }
                                                  else {
                                                    bVar2 = std::operator==(in_RDI,(char *)CONCAT17(
                                                  bVar1,in_stack_ffffffffffffffe8));
                                                  if (bVar2) {
                                                    if ((bVar1 & 1) == 0) {
                                                      local_4 = difference;
                                                    }
                                                    else {
                                                      local_4 = unary_minus;
                                                    }
                                                  }
                                                  else {
                                                    bVar2 = std::operator==(in_RDI,(char *)CONCAT17(
                                                  bVar1,in_stack_ffffffffffffffe8));
                                                  if (bVar2) {
                                                    local_4 = quotient;
                                                  }
                                                  else {
                                                    bVar2 = std::operator==(in_RDI,(char *)CONCAT17(
                                                  bVar1,in_stack_ffffffffffffffe8));
                                                  if (bVar2) {
                                                    local_4 = product;
                                                  }
                                                  else {
                                                    local_4 = invalid;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

static Opers to_operator(const std::string &t_str, bool t_is_unary = false)
    {
      if (t_str == "==")
      {
        return equals;
      } else if (t_str == "<") {
        return less_than;
      } else if (t_str == ">") {
        return greater_than;
      } else if (t_str == "<=") {
        return less_than_equal; 
      } else if (t_str == ">=") {
        return greater_than_equal;
      } else if (t_str == "!=") {
        return not_equal;
      } else if (t_str == "=") {
        return assign;
      } else if (t_str == "++") {
        return pre_increment;
      } else if (t_str == "--") {
        return pre_decrement;
      } else if (t_str == "*=") {
        return assign_product;
      } else if (t_str == "+=") {
        return assign_sum;
      } else if (t_str == "-=") {
        return assign_difference;
      } else if (t_str == "&=") {
        return assign_bitwise_and;
      } else if (t_str == "|=") {
        return assign_bitwise_or;
      } else if (t_str == "<<=") {
        return assign_shift_left;
      } else if (t_str == ">>=") {
        return assign_shift_right;
      } else if (t_str == "%=") {
        return assign_remainder;
      } else if (t_str == "^=") {
        return assign_bitwise_xor;
      } else if (t_str == "<<") {
        return shift_left;
      } else if (t_str == ">>") {
        return shift_right;
      } else if (t_str == "%") {
        return remainder;
      } else if (t_str == "&") { 
        return bitwise_and;
      } else if (t_str == "|") {
        return bitwise_or;
      } else if (t_str == "^") {
        return bitwise_xor;
      } else if (t_str == "~") {
        return bitwise_complement;
      } else if (t_str == "+") {
        if (t_is_unary) {
          return unary_plus;
        } else {
          return sum;
        }
      } else if (t_str == "-") {
        if (t_is_unary) {
          return unary_minus;
        } else {
          return difference;
        }
      } else if (t_str == "/") {
        return quotient;
      } else if (t_str == "*") {
        return product;
      } else {
        return invalid;
      } 
    }